

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O0

void QSslContext::applyBackendConfig(QSslContext *sslContext)

{
  bool bVar1;
  int iVar2;
  size_type_conflict sVar3;
  QByteArray *a;
  long in_RDI;
  long in_FS_OFFSET;
  int result;
  QByteArray *value;
  QMap<QByteArray,_QVariant> *conf;
  const_iterator i;
  QSharedPointer<ssl_conf_ctx_st> cctx;
  const_iterator ocspResponsePos;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  uint in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  ssl_conf_ctx_st *in_stack_fffffffffffffda8;
  QSharedPointer<ssl_conf_ctx_st> *in_stack_fffffffffffffdb0;
  QMetaType in_stack_fffffffffffffdb8;
  QVariant *in_stack_fffffffffffffdc0;
  QString *this;
  int local_21c;
  QString *pQVar4;
  QChar fillChar;
  QChar local_b2 [37];
  QMetaType local_68;
  char *local_60;
  const_iterator local_58;
  const_iterator local_50;
  undefined8 local_48;
  undefined8 local_40;
  const_iterator local_38;
  QByteArray local_30;
  const_iterator local_18;
  char16_t *local_8;
  
  local_8 = *(char16_t **)(in_FS_OFFSET + 0x28);
  QSslConfiguration::backendConfiguration();
  this = (QString *)&stack0xfffffffffffffff0;
  bVar1 = QMap<QByteArray,_QVariant>::isEmpty
                    ((QMap<QByteArray,_QVariant> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  if (!bVar1) {
    local_18._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    pQVar4 = this;
    QByteArray::QByteArray(&local_30,"Qt-OCSP-response",-1);
    local_18._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QVariant>::find
                   ((QMap<QByteArray,_QVariant> *)in_stack_fffffffffffffdb0,
                    (QByteArray *)in_stack_fffffffffffffda8);
    QByteArray::~QByteArray((QByteArray *)0x16008b);
    local_38._M_node =
         (_Base_ptr)
         QMap<QByteArray,_QVariant>::end((QMap<QByteArray,_QVariant> *)in_stack_fffffffffffffdb0);
    bVar1 = ::operator!=((const_iterator *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (const_iterator *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    if (bVar1) {
      q_SSL_CTX_callback_ctrl
                ((SSL_CTX *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                 (GenericCallbackType)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
      ;
      sVar3 = QMap<QByteArray,_QVariant>::size
                        ((QMap<QByteArray,_QVariant> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      if (sVar3 == 1) goto LAB_001606e9;
    }
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    q_SSL_CONF_CTX_new();
    QSharedPointer<ssl_conf_ctx_st>::
    QSharedPointer<ssl_conf_ctx_st,_void_(*)(ssl_conf_ctx_st_*),_true>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (_func_void_ssl_conf_ctx_st_ptr *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    bVar1 = QSharedPointer::operator_cast_to_bool((QSharedPointer<ssl_conf_ctx_st> *)0x160137);
    if (bVar1) {
      QSharedPointer<ssl_conf_ctx_st>::data((QSharedPointer<ssl_conf_ctx_st> *)0x16014d);
      q_SSL_CONF_CTX_set_ssl_ctx
                ((SSL_CONF_CTX *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (SSL_CTX *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QSharedPointer<ssl_conf_ctx_st>::data((QSharedPointer<ssl_conf_ctx_st> *)0x16016a);
      q_SSL_CONF_CTX_set_flags
                ((SSL_CONF_CTX *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),0);
      local_50._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
      local_50._M_node =
           (_Base_ptr)
           QMap<QByteArray,_QVariant>::constBegin
                     ((QMap<QByteArray,_QVariant> *)
                      CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      while( true ) {
        local_58._M_node =
             (_Base_ptr)
             QMap<QByteArray,_QVariant>::constEnd
                       ((QMap<QByteArray,_QVariant> *)
                        CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        bVar1 = ::operator!=((const_iterator *)
                             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                             (const_iterator *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        if (!bVar1) break;
        QMap<QByteArray,_QVariant>::const_iterator::key((const_iterator *)0x1601d5);
        local_60 = "Qt-OCSP-response";
        bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffdb0,
                             (char **)in_stack_fffffffffffffda8);
        iVar2 = in_stack_fffffffffffffda4;
        if (!bVar1) {
          in_stack_fffffffffffffdc0 =
               QMap<QByteArray,_QVariant>::const_iterator::value((const_iterator *)0x16020c);
          iVar2 = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
          QMetaType::QMetaType(&local_68,0xc);
          bVar1 = QVariant::canConvert
                            ((QVariant *)in_stack_fffffffffffffda8,in_stack_fffffffffffffdb8);
          fillChar.ucs = (char16_t)((ulong)pQVar4 >> 0x30);
          if (!bVar1) {
            *(undefined4 *)(in_RDI + 0x34) = 0xffffffff;
            QSslSocket::tr((char *)in_stack_fffffffffffffda8,
                           (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           in_stack_fffffffffffffd9c);
            a = QMap<QByteArray,_QVariant>::const_iterator::key((const_iterator *)0x160273);
            QChar::QChar<char16_t,_true>(local_b2,L' ');
            QString::arg<QByteArray,_true>((QString *)in_stack_fffffffffffffdc0,a,iVar2,fillChar);
            msgErrorSettingBackendConfig((QString *)in_stack_fffffffffffffdc0);
            QString::operator=((QString *)
                               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
            QString::~QString((QString *)0x1602e7);
            QString::~QString((QString *)0x1602f4);
            QString::~QString((QString *)0x160301);
            goto LAB_001606dc;
          }
          QMap<QByteArray,_QVariant>::const_iterator::value((const_iterator *)0x16032a);
          QVariant::toByteArray();
          in_stack_fffffffffffffda8 =
               QSharedPointer<ssl_conf_ctx_st>::data((QSharedPointer<ssl_conf_ctx_st> *)0x160354);
          QMap<QByteArray,_QVariant>::const_iterator::key((const_iterator *)0x160366);
          in_stack_fffffffffffffdb0 =
               (QSharedPointer<ssl_conf_ctx_st> *)QByteArray::constData((QByteArray *)0x16036e);
          QByteArray::constData((QByteArray *)0x16037d);
          iVar2 = q_SSL_CONF_cmd(in_stack_fffffffffffffda8,
                                 (char *)CONCAT44(in_stack_fffffffffffffda4,
                                                  in_stack_fffffffffffffda0),
                                 (char *)CONCAT44(in_stack_fffffffffffffd9c,
                                                  in_stack_fffffffffffffd98));
          if (iVar2 == 2) {
            local_21c = 4;
            iVar2 = in_stack_fffffffffffffda4;
          }
          else {
            *(undefined4 *)(in_RDI + 0x34) = 0xffffffff;
            if (iVar2 == 0) {
              QSslSocket::tr((char *)in_stack_fffffffffffffda8,
                             (char *)(ulong)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
              QMap<QByteArray,_QVariant>::const_iterator::key((const_iterator *)0x1603fd);
              QString::arg<QByteArray_const&,QByteArray_const&>
                        (this,(QByteArray *)in_stack_fffffffffffffdc0,
                         (QByteArray *)in_stack_fffffffffffffdb8.d_ptr);
              msgErrorSettingBackendConfig((QString *)in_stack_fffffffffffffdc0);
              QString::operator=((QString *)CONCAT44(iVar2,in_stack_fffffffffffffda0),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
              QString::~QString((QString *)0x160452);
              QString::~QString((QString *)0x16045f);
              QString::~QString((QString *)0x16046c);
              local_21c = 1;
            }
            else if (iVar2 == 1) {
              QSslSocket::tr((char *)in_stack_fffffffffffffda8,
                             (char *)CONCAT44(1,in_stack_fffffffffffffda0),in_stack_fffffffffffffd9c
                            );
              QMap<QByteArray,_QVariant>::const_iterator::key((const_iterator *)0x1604a3);
              QString::arg<QByteArray_const&,QByteArray_const&>
                        (this,(QByteArray *)in_stack_fffffffffffffdc0,
                         (QByteArray *)in_stack_fffffffffffffdb8.d_ptr);
              msgErrorSettingBackendConfig((QString *)in_stack_fffffffffffffdc0);
              QString::operator=((QString *)CONCAT44(iVar2,in_stack_fffffffffffffda0),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
              QString::~QString((QString *)0x1604f8);
              QString::~QString((QString *)0x160505);
              QString::~QString((QString *)0x160512);
              local_21c = 1;
            }
            else {
              QSslSocket::tr((char *)in_stack_fffffffffffffda8,
                             (char *)CONCAT44(iVar2,in_stack_fffffffffffffda0),
                             in_stack_fffffffffffffd9c);
              QMap<QByteArray,_QVariant>::const_iterator::key((const_iterator *)0x160549);
              QString::arg<QByteArray_const&,QByteArray_const&>
                        (this,(QByteArray *)in_stack_fffffffffffffdc0,
                         (QByteArray *)in_stack_fffffffffffffdb8.d_ptr);
              msgErrorSettingBackendConfig((QString *)in_stack_fffffffffffffdc0);
              QString::operator=((QString *)CONCAT44(iVar2,in_stack_fffffffffffffda0),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
              QString::~QString((QString *)0x16059e);
              QString::~QString((QString *)0x1605ab);
              QString::~QString((QString *)0x1605b8);
              local_21c = 1;
            }
          }
          QByteArray::~QByteArray((QByteArray *)0x1605cd);
          if (local_21c != 4) goto LAB_001606dc;
        }
        QMap<QByteArray,_QVariant>::const_iterator::operator++
                  ((const_iterator *)CONCAT44(iVar2,in_stack_fffffffffffffda0));
        in_stack_fffffffffffffda4 = iVar2;
      }
      QSharedPointer<ssl_conf_ctx_st>::data((QSharedPointer<ssl_conf_ctx_st> *)0x1605fb);
      iVar2 = q_SSL_CONF_CTX_finish
                        ((SSL_CONF_CTX *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      if (iVar2 == 0) {
        QSslSocket::tr((char *)in_stack_fffffffffffffda8,
                       (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd9c);
        msgErrorSettingBackendConfig((QString *)in_stack_fffffffffffffdc0);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
        ;
        QString::~QString((QString *)0x16065d);
        QString::~QString((QString *)0x16066a);
        *(undefined4 *)(in_RDI + 0x34) = 0xffffffff;
      }
    }
    else {
      QSslSocket::tr((char *)in_stack_fffffffffffffda8,
                     (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd9c);
      msgErrorSettingBackendConfig((QString *)in_stack_fffffffffffffdc0);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QString::~QString((QString *)0x1606be);
      QString::~QString((QString *)0x1606c8);
      *(undefined4 *)(in_RDI + 0x34) = 0xffffffff;
    }
LAB_001606dc:
    QSharedPointer<ssl_conf_ctx_st>::~QSharedPointer((QSharedPointer<ssl_conf_ctx_st> *)0x1606e9);
  }
LAB_001606e9:
  QMap<QByteArray,_QVariant>::~QMap((QMap<QByteArray,_QVariant> *)0x1606f6);
  if (*(char16_t **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslContext::applyBackendConfig(QSslContext *sslContext)
{
    const QMap<QByteArray, QVariant> &conf = sslContext->sslConfiguration.backendConfiguration();
    if (conf.isEmpty())
        return;

#if QT_CONFIG(ocsp)
    auto ocspResponsePos = conf.find("Qt-OCSP-response");
    if (ocspResponsePos != conf.end()) {
        // This is our private, undocumented configuration option, existing only for
        // the purpose of testing OCSP status responses. We don't even check this
        // callback was set. If no - the test must fail.
        q_SSL_CTX_set_tlsext_status_cb(sslContext->ctx, QTlsPrivate::qt_OCSP_status_server_callback);
        if (conf.size() == 1)
            return;
    }
#endif // ocsp

    QSharedPointer<SSL_CONF_CTX> cctx(q_SSL_CONF_CTX_new(), &q_SSL_CONF_CTX_free);
    if (cctx) {
        q_SSL_CONF_CTX_set_ssl_ctx(cctx.data(), sslContext->ctx);
        q_SSL_CONF_CTX_set_flags(cctx.data(), SSL_CONF_FLAG_FILE);

        for (auto i = conf.constBegin(); i != conf.constEnd(); ++i) {
            if (i.key() == "Qt-OCSP-response") // This never goes to SSL_CONF_cmd().
                continue;

            if (!i.value().canConvert(QMetaType(QMetaType::QByteArray))) {
                sslContext->errorCode = QSslError::UnspecifiedError;
                sslContext->errorStr = msgErrorSettingBackendConfig(
                QSslSocket::tr("Expecting QByteArray for %1").arg(i.key()));
                return;
            }

            const QByteArray &value = i.value().toByteArray();
            const int result = q_SSL_CONF_cmd(cctx.data(), i.key().constData(), value.constData());
            if (result == 2)
                continue;

            sslContext->errorCode = QSslError::UnspecifiedError;
            switch (result) {
            case 0:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("An error occurred attempting to set %1 to %2")
                            .arg(i.key(), value));
                return;
            case 1:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("Wrong value for %1 (%2)").arg(i.key(), value));
                return;
            default:
                sslContext->errorStr = msgErrorSettingBackendConfig(
                    QSslSocket::tr("Unrecognized command %1 = %2").arg(i.key(), value));
                return;
            }
        }

        if (q_SSL_CONF_CTX_finish(cctx.data()) == 0) {
            sslContext->errorStr = msgErrorSettingBackendConfig(QSslSocket::tr("SSL_CONF_finish() failed"));
            sslContext->errorCode = QSslError::UnspecifiedError;
        }
    } else {
        sslContext->errorStr = msgErrorSettingBackendConfig(QSslSocket::tr("SSL_CONF_CTX_new() failed"));
        sslContext->errorCode = QSslError::UnspecifiedError;
    }
}